

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O1

void __thiscall irr::gui::CGUIScrollBar::setMax(CGUIScrollBar *this,s32 max)

{
  ulong uVar1;
  
  this->Max = max;
  if (max < this->Min) {
    this->Min = max;
  }
  uVar1 = (ulong)(1e-06 < ABS((float)(max - this->Min)));
  (*(this->UpButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x13])
            (this->UpButton,uVar1);
  (*(this->DownButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x13])
            (this->DownButton,uVar1);
  (**(code **)(*(long *)this + 0x168))(this,this->Pos);
  return;
}

Assistant:

void CGUIScrollBar::setMax(s32 max)
{
	Max = max;
	if (Min > Max)
		Min = Max;

	bool enable = core::isnotzero(range());
	UpButton->setEnabled(enable);
	DownButton->setEnabled(enable);
	setPos(Pos);
}